

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi00.hpp
# Opt level: O0

string * __thiscall
websocketpp::processor::hybi00<websocketpp::config::asio>::get_raw_abi_cxx11_
          (hybi00<websocketpp::config::asio> *this,response_type *res)

{
  response *in_RDX;
  response *in_RDI;
  response *in_stack_00000068;
  response_type temp;
  string *in_stack_fffffffffffffe68;
  parser *in_stack_fffffffffffffe70;
  response *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  response *this_00;
  undefined1 local_161 [33];
  string local_140 [55];
  allocator local_109;
  string local_108 [240];
  response *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  http::parser::response::response(in_RDI,in_stack_fffffffffffffe78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"Sec-WebSocket-Key3",&local_109);
  http::parser::parser::remove_header(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  http::parser::response::raw_abi_cxx11_(in_stack_00000068);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_161 + 1),"Sec-WebSocket-Key3",(allocator *)__lhs);
  http::parser::parser::get_header(&this_00->super_parser,(string *)in_RDI);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18
                );
  std::__cxx11::string::~string((string *)(local_161 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  std::__cxx11::string::~string(local_140);
  http::parser::response::~response(local_18);
  return (string *)this_00;
}

Assistant:

std::string get_raw(response_type const & res) const {
        response_type temp = res;
        temp.remove_header("Sec-WebSocket-Key3");
        return temp.raw() + res.get_header("Sec-WebSocket-Key3");
    }